

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_upto_with_circular_reuse_test(void)

{
  void *__s1;
  fdb_doc *doc_00;
  fdb_status fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__format;
  ulong uVar5;
  fdb_file_handle *dbfile;
  ulong local_4a0;
  fdb_doc *doc;
  uint64_t num_markers;
  int local_484;
  fdb_snapshot_info_t *markers_out;
  fdb_kvs_handle *db [3];
  fdb_kvs_config local_458;
  timeval __test_begin;
  fdb_config local_430;
  char valuebuf [512];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  local_430.buffercache_size = 0;
  local_430.num_keeping_headers = 10;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&dbfile,"compact_test",&local_430);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd5b);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd5b,"void compact_upto_with_circular_reuse_test()");
  }
  fVar1 = fdb_kvs_open(dbfile,db,(char *)0x0,&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd5e);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd5e,"void compact_upto_with_circular_reuse_test()");
  }
  fVar1 = fdb_kvs_open(dbfile,db + 1,"db1",&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd61);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd61,"void compact_upto_with_circular_reuse_test()");
  }
  fVar1 = fdb_kvs_open(dbfile,db + 2,"db2",&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd64);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd64,"void compact_upto_with_circular_reuse_test()");
  }
  memset(valuebuf,0x78,0x100);
  valuebuf[0x100] = '\0';
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    local_4a0 = 0;
    iVar3 = 0;
    while (iVar3 != 0x40) {
      local_484 = iVar3;
      for (uVar5 = 1; uVar5 != 3; uVar5 = uVar5 + 1) {
        iVar3 = 0;
        while (iVar3 != 100) {
          sprintf(keybuf,"k%06d",(ulong)(uint)((int)local_4a0 + iVar3));
          sprintf(valuebuf,"v%d_%04d_%d",uVar5 & 0xffffffff);
          fVar1 = fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,valuebuf,0x101);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd70);
            compact_upto_with_circular_reuse_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd70,"void compact_upto_with_circular_reuse_test()");
          }
          fVar1 = fdb_set(db[uVar5],doc);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd72);
            compact_upto_with_circular_reuse_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd72,"void compact_upto_with_circular_reuse_test()");
          }
          fVar1 = fdb_doc_free(doc);
          iVar3 = iVar3 + 1;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd74);
            compact_upto_with_circular_reuse_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd74,"void compact_upto_with_circular_reuse_test()");
          }
        }
      }
      fVar1 = fdb_commit(dbfile,'\0');
      iVar3 = local_484 + 1;
      local_4a0 = (ulong)((int)local_4a0 + 100);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xd78);
        compact_upto_with_circular_reuse_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd78,"void compact_upto_with_circular_reuse_test()");
      }
    }
  }
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers_out,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd80);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd80,"void compact_upto_with_circular_reuse_test()");
  }
  if (local_430.num_keeping_headers < num_markers) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
           );
    compact_upto_with_circular_reuse_test()::__test_pass = '\x01';
    if (local_430.num_keeping_headers < num_markers) {
      __assert_fail("num_markers <= config.num_keeping_headers",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd83,"void compact_upto_with_circular_reuse_test()");
    }
  }
  fVar1 = fdb_compact_upto(dbfile,"compact_test_compact",markers_out[5].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd86);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd86,"void compact_upto_with_circular_reuse_test()");
  }
  fVar1 = fdb_free_snap_markers(markers_out,num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd89);
    compact_upto_with_circular_reuse_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd89,"void compact_upto_with_circular_reuse_test()");
  }
  iVar3 = 0;
  iVar4 = 0;
  do {
    if (iVar4 == 0x40) {
      fVar1 = fdb_close(dbfile);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xda1);
        compact_upto_with_circular_reuse_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xda1,"void compact_upto_with_circular_reuse_test()");
      }
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        __format = "%s PASSED\n";
        if (compact_upto_with_circular_reuse_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"compact upto with circular reuse test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xda4);
      compact_upto_with_circular_reuse_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xda4,"void compact_upto_with_circular_reuse_test()");
    }
    local_4a0 = CONCAT44(local_4a0._4_4_,iVar4);
    for (uVar5 = 1; uVar5 != 3; uVar5 = uVar5 + 1) {
      iVar4 = 0;
      while (iVar4 != 100) {
        sprintf(keybuf,"k%06d",(ulong)(uint)(iVar3 + iVar4));
        sprintf(valuebuf,"v%d_%04d_%d",uVar5 & 0xffffffff);
        fVar1 = fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,(void *)0x0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd94);
          compact_upto_with_circular_reuse_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd94,"void compact_upto_with_circular_reuse_test()");
        }
        fVar1 = fdb_get(db[uVar5],doc);
        doc_00 = doc;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd96);
          compact_upto_with_circular_reuse_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd96,"void compact_upto_with_circular_reuse_test()");
        }
        __s1 = doc->body;
        iVar2 = bcmp(__s1,valuebuf,doc->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",valuebuf,__s1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd97);
          compact_upto_with_circular_reuse_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd97,"void compact_upto_with_circular_reuse_test()");
        }
        fVar1 = fdb_doc_free(doc_00);
        iVar4 = iVar4 + 1;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd99);
          compact_upto_with_circular_reuse_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd99,"void compact_upto_with_circular_reuse_test()");
        }
      }
    }
    fVar1 = fdb_commit(dbfile,'\0');
    iVar4 = (int)local_4a0 + 1;
    iVar3 = iVar3 + 100;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd9d);
      compact_upto_with_circular_reuse_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd9d,"void compact_upto_with_circular_reuse_test()");
    }
  } while( true );
}

Assistant:

void compact_upto_with_circular_reuse_test()
{
    TEST_INIT();
    int batch=100, n_batch=64, n_dbs=3, i, j, r, k, idx;
    int n_repeat = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[3];
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.num_keeping_headers = 10;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[2], "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 256);
    valuebuf[256] = 0;
    for (k=0; k<n_repeat; ++k) {
        for (r=0; r<n_batch; ++r) {
            for (j=1; j<n_dbs; ++j) {
                for (i=0; i<batch; ++i) {
                    idx = r*batch + i;
                    sprintf(keybuf, "k%06d", idx);
                    sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                    s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 257);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_set(db[j], doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_doc_free(doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                }
            }
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // num_markers should be equal to or smaller than num_keeping_headers
    TEST_CHK(num_markers <= config.num_keeping_headers);

    s = fdb_compact_upto(dbfile, "compact_test_compact", markers_out[5].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // all docs should be retrieved correclty.
    k = n_repeat - 1;
    for (r=0; r<n_batch; ++r) {
        for (j=1; j<n_dbs; ++j) {
            for (i=0; i<batch; ++i) {
                idx = r*batch + i;
                sprintf(keybuf, "k%06d", idx);
                sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_get(db[j], doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                TEST_CMP(doc->body, valuebuf, doc->bodylen);
                s = fdb_doc_free(doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("compact upto with circular reuse test");
}